

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86_fma::Convolution_x86_fma(Convolution_x86_fma *this,void **vtt)

{
  void **vtt_local;
  Convolution_x86_fma *this_local;
  
  this->_vptr_Convolution_x86_fma = (_func_int **)*vtt;
  *(void **)((long)&this->_vptr_Convolution_x86_fma + (long)this->_vptr_Convolution_x86_fma[-3]) =
       vtt[1];
  (this->weight_data_tm).data = (void *)0x0;
  (this->weight_data_tm).refcount = (int *)0x0;
  (this->weight_data_tm).elemsize = 0;
  (this->weight_data_tm).elempack = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  (this->weight_data_tm).cstep = 0;
  (this->weight_sgemm_data).data = (void *)0x0;
  (this->weight_sgemm_data).refcount = (int *)0x0;
  (this->weight_sgemm_data).elemsize = 0;
  (this->weight_sgemm_data).elempack = 0;
  (this->weight_sgemm_data).allocator = (Allocator *)0x0;
  (this->weight_sgemm_data).dims = 0;
  (this->weight_sgemm_data).w = 0;
  (this->weight_sgemm_data).h = 0;
  (this->weight_sgemm_data).d = 0;
  (this->weight_sgemm_data).c = 0;
  (this->weight_sgemm_data).cstep = 0;
  (this->weight_winograd23_data).data = (void *)0x0;
  (this->weight_winograd23_data).refcount = (int *)0x0;
  (this->weight_winograd23_data).elemsize = 0;
  (this->weight_winograd23_data).elempack = 0;
  (this->weight_winograd23_data).allocator = (Allocator *)0x0;
  (this->weight_winograd23_data).dims = 0;
  (this->weight_winograd23_data).w = 0;
  (this->weight_winograd23_data).h = 0;
  (this->weight_winograd23_data).d = 0;
  (this->weight_winograd23_data).c = 0;
  (this->weight_winograd23_data).cstep = 0;
  (this->weight_winograd43_data).data = (void *)0x0;
  (this->weight_winograd43_data).refcount = (int *)0x0;
  (this->weight_winograd43_data).elemsize = 0;
  (this->weight_winograd43_data).elempack = 0;
  (this->weight_winograd43_data).allocator = (Allocator *)0x0;
  (this->weight_winograd43_data).dims = 0;
  (this->weight_winograd43_data).w = 0;
  (this->weight_winograd43_data).h = 0;
  (this->weight_winograd43_data).d = 0;
  (this->weight_winograd43_data).c = 0;
  (this->weight_winograd43_data).cstep = 0;
  (this->weight_winograd63_data).data = (void *)0x0;
  (this->weight_winograd63_data).refcount = (int *)0x0;
  (this->weight_winograd63_data).elemsize = 0;
  (this->weight_winograd63_data).elempack = 0;
  (this->weight_winograd63_data).allocator = (Allocator *)0x0;
  (this->weight_winograd63_data).dims = 0;
  (this->weight_winograd63_data).w = 0;
  (this->weight_winograd63_data).h = 0;
  (this->weight_winograd63_data).d = 0;
  (this->weight_winograd63_data).c = 0;
  (this->weight_winograd63_data).cstep = 0;
  (this->scale_in_data).data = (void *)0x0;
  (this->scale_in_data).refcount = (int *)0x0;
  (this->scale_in_data).elemsize = 0;
  (this->scale_in_data).elempack = 0;
  (this->scale_in_data).allocator = (Allocator *)0x0;
  (this->scale_in_data).dims = 0;
  (this->scale_in_data).w = 0;
  (this->scale_in_data).h = 0;
  (this->scale_in_data).d = 0;
  (this->scale_in_data).c = 0;
  (this->scale_in_data).cstep = 0;
  *(code *)((long)&this->activation + (long)(this->_vptr_Convolution_x86_fma[-3] + 3)) = (code)0x1;
  this->activation = (Layer *)0x0;
  this->nT = 0;
  this->convolution_dilation1 = (Layer *)0x0;
  this->gemm = (Layer *)0x0;
  return;
}

Assistant:

Convolution_x86_fma::Convolution_x86_fma()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    nT = 0;
    convolution_dilation1 = 0;
    gemm = 0;
}